

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DebugInfoManager::ClearDebugScopeAndInlinedAtUses
          (DebugInfoManager *this,Instruction *inst)

{
  _Hash_node_base *p_Var1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  _Var6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  
  uVar3 = 0;
  if (inst->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
    uVar3 = (ulong)uVar2;
  }
  uVar5 = (this->scope_id_to_users_)._M_h._M_bucket_count;
  uVar4 = uVar3 % uVar5;
  p_Var7 = (this->scope_id_to_users_)._M_h._M_buckets[uVar4];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var7->_M_nxt, p_Var8 = p_Var7, (uint)uVar3 != *(uint *)&p_Var7->_M_nxt[1]._M_nxt))
  {
    while (p_Var7 = p_Var1, p_Var1 = p_Var7->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var1[1]._M_nxt % uVar5 != uVar4) ||
         (p_Var8 = p_Var7, (uint)uVar3 == *(uint *)&p_Var1[1]._M_nxt)) goto LAB_0059cfe3;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0059cfe3:
  if (p_Var8 == (__node_base_ptr)0x0) {
    _Var6._M_cur = (__node_type *)0x0;
  }
  else {
    _Var6._M_cur = (__node_type *)p_Var8->_M_nxt;
  }
  if (_Var6._M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->scope_id_to_users_)._M_h,(const_iterator)_Var6._M_cur);
  }
  uVar2 = 0;
  if (inst->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  uVar3 = (this->inlinedat_id_to_users_)._M_h._M_bucket_count;
  uVar5 = (ulong)uVar2 % uVar3;
  p_Var7 = (this->inlinedat_id_to_users_)._M_h._M_buckets[uVar5];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var7->_M_nxt, p_Var8 = p_Var7, uVar2 != *(uint *)&p_Var7->_M_nxt[1]._M_nxt)) {
    while (p_Var7 = p_Var1, p_Var1 = p_Var7->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var1[1]._M_nxt % uVar3 != uVar5) ||
         (p_Var8 = p_Var7, uVar2 == *(uint *)&p_Var1[1]._M_nxt)) goto LAB_0059d076;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0059d076:
  if (p_Var8 == (__node_base_ptr)0x0) {
    _Var6._M_cur = (__node_type *)0x0;
  }
  else {
    _Var6._M_cur = (__node_type *)p_Var8->_M_nxt;
  }
  if (_Var6._M_cur == (__node_type *)0x0) {
    return;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->inlinedat_id_to_users_)._M_h,(const_iterator)_Var6._M_cur);
  return;
}

Assistant:

void DebugInfoManager::ClearDebugScopeAndInlinedAtUses(Instruction* inst) {
  auto scope_id_to_users_itr = scope_id_to_users_.find(inst->result_id());
  if (scope_id_to_users_itr != scope_id_to_users_.end()) {
    scope_id_to_users_.erase(scope_id_to_users_itr);
  }
  auto inlinedat_id_to_users_itr =
      inlinedat_id_to_users_.find(inst->result_id());
  if (inlinedat_id_to_users_itr != inlinedat_id_to_users_.end()) {
    inlinedat_id_to_users_.erase(inlinedat_id_to_users_itr);
  }
}